

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O1

Mat6x6d * __thiscall
OpenMD::HydroProp::getDiffusionTensor
          (Mat6x6d *__return_storage_ptr__,HydroProp *this,RealType temperature)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  double (*padVar11) [6];
  long lVar12;
  uint i;
  int iScratch [10];
  Mat6x6d XiCopy;
  Real dScratch [10];
  int local_1b8 [12];
  SquareMatrix<double,_6> local_188;
  double local_68 [11];
  
  if (&local_188 != &this->Xi_) {
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x10);
      uVar7 = *puVar1;
      uVar8 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x20);
      uVar9 = puVar1[1];
      *(undefined8 *)((long)local_188.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x20) =
           *puVar1;
      *(undefined8 *)((long)local_188.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x28) =
           uVar9;
      *(undefined8 *)((long)local_188.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x10) =
           uVar7;
      *(undefined8 *)((long)local_188.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x18) =
           uVar8;
      *(undefined8 *)((long)local_188.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10) = uVar5;
      *(undefined8 *)((long)local_188.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 8) =
           uVar6;
      lVar10 = lVar10 + 0x30;
    } while (lVar10 != 0x120);
  }
  lVar10 = 0;
  memset(__return_storage_ptr__,0,0x120);
  invertMatrix<OpenMD::SquareMatrix<double,6>>
            (&local_188,__return_storage_ptr__,6,local_1b8,local_68);
  padVar11 = (double (*) [6])__return_storage_ptr__;
  do {
    lVar12 = 0;
    do {
      pdVar2 = ((RectMatrix<double,_6U,_6U> *)*padVar11)->data_[0] + lVar12;
      dVar4 = pdVar2[1];
      pdVar3 = ((RectMatrix<double,_6U,_6U> *)*padVar11)->data_[0] + lVar12;
      *pdVar3 = *pdVar2 * temperature * 0.0019872156;
      pdVar3[1] = dVar4 * temperature * 0.0019872156;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 6);
    lVar10 = lVar10 + 1;
    padVar11 = padVar11 + 1;
  } while (lVar10 != 6);
  return __return_storage_ptr__;
}

Assistant:

Mat6x6d HydroProp::getDiffusionTensor(RealType temperature) {
    Mat6x6d XiCopy = Xi_;
    Mat6x6d D;
    invertMatrix(XiCopy, D);
    RealType kt = Constants::kb * temperature;  // in kcal mol^-1
    D *= kt;  // now in angstroms^2 fs^-1  (at least for Trans-trans)
    return D;
  }